

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::to_initializer_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t uVar2;
  Types TVar3;
  Variant *this_00;
  SPIRConstant *c;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  SPIRType *local_88;
  SPIRType *init_type;
  string local_60;
  undefined1 local_29;
  SPIRType *local_28;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerMSL *this_local;
  string *expr;
  
  type = (SPIRType *)var;
  var_local = (SPIRVariable *)this;
  this_local = (CompilerMSL *)__return_storage_ptr__;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  local_28 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  local_29 = 0;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->vecsize);
  this_00 = VectorView<spirv_cross::Variant>::operator[]
                      (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>,(ulong)uVar2);
  TVar3 = Variant::get_type(this_00);
  if ((TVar3 != TypeConstant) ||
     ((bVar1 = VectorView<unsigned_int>::empty(&(local_28->array).super_VectorView<unsigned_int>),
      bVar1 && (local_28->basetype != Struct)))) {
    CompilerGLSL::to_initializer_expression_abi_cxx11_
              ((string *)&init_type,&this->super_CompilerGLSL,(SPIRVariable *)type);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&init_type);
    ::std::__cxx11::string::~string((string *)&init_type);
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->vecsize);
    c = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,uVar2);
    CompilerGLSL::constant_expression_abi_cxx11_(&local_60,&this->super_CompilerGLSL,c,false,false);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->vecsize);
  local_88 = Compiler::expression_type((Compiler *)this,uVar2);
  bVar1 = VectorView<unsigned_int>::empty(&(local_28->array).super_VectorView<unsigned_int>);
  if (((bVar1) && (local_28->basetype != Struct)) && (local_28->vecsize < local_88->vecsize)) {
    __rhs = CompilerGLSL::vector_swizzle(local_28->vecsize,0);
    ::std::operator+(&local_c8,__return_storage_ptr__,__rhs);
    CompilerGLSL::enclose_expression(&local_a8,&this->super_CompilerGLSL,&local_c8);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_initializer_expression(const SPIRVariable &var)
{
	// We risk getting an array initializer here with MSL. If we have an array.
	// FIXME: We cannot handle non-constant arrays being initialized.
	// We will need to inject spvArrayCopy here somehow ...
	auto &type = get<SPIRType>(var.basetype);
	string expr;
	if (ir.ids[var.initializer].get_type() == TypeConstant &&
	    (!type.array.empty() || type.basetype == SPIRType::Struct))
		expr = constant_expression(get<SPIRConstant>(var.initializer));
	else
		expr = CompilerGLSL::to_initializer_expression(var);
	// If the initializer has more vector components than the variable, add a swizzle.
	// FIXME: This can't handle arrays or structs.
	auto &init_type = expression_type(var.initializer);
	if (type.array.empty() && type.basetype != SPIRType::Struct && init_type.vecsize > type.vecsize)
		expr = enclose_expression(expr + vector_swizzle(type.vecsize, 0));
	return expr;
}